

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

bool __thiscall
QSqlTableModel::removeRows(QSqlTableModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Op OVar5;
  QSqlTableModelPrivate *pQVar6;
  ModifiedRow *this_00;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  ModifiedRow *mrow;
  QSqlTableModelPrivate *d;
  int idx;
  ModifiedRow *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  byte in_stack_ffffffffffffff07;
  CacheMap *in_stack_ffffffffffffff08;
  ushort in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  undefined1 uVar7;
  int in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff20;
  undefined3 uVar8;
  undefined4 in_stack_ffffffffffffff24;
  undefined5 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff35;
  byte in_stack_ffffffffffffff36;
  byte in_stack_ffffffffffffff37;
  bool local_a1;
  int local_94;
  undefined1 local_88 [28];
  int local_6c;
  ModifiedRow local_28;
  long local_8;
  int row_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = in_ESI;
  pQVar6 = d_func((QSqlTableModel *)0x16fd00);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
  uVar8 = (undefined3)in_stack_ffffffffffffff24;
  row_00 = CONCAT13(1,uVar8);
  if (((!bVar1) && (row_00 = CONCAT13(1,uVar8), -1 < local_6c)) &&
     (row_00 = CONCAT13(1,uVar8), 0 < in_EDX)) {
    in_stack_ffffffffffffff14 = local_6c + in_EDX;
    QModelIndex::QModelIndex((QModelIndex *)0x16fd55);
    iVar4 = (**(code **)(*in_RDI + 0x78))(in_RDI,local_88);
    row_00 = CONCAT13(iVar4 < in_stack_ffffffffffffff14,(int3)row_00);
  }
  if ((char)((uint)row_00 >> 0x18) == '\0') {
    if (pQVar6->strategy != OnManualSubmit) {
      in_stack_ffffffffffffff37 = 0;
      in_stack_ffffffffffffff36 = 0;
      in_stack_ffffffffffffff35 = 0;
      uVar7 = true;
      bVar1 = (bool)uVar7;
      if (in_EDX < 2) {
        in_stack_ffffffffffffff08 = &pQVar6->cache;
        QSqlRecord::QSqlRecord
                  ((QSqlRecord *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
        in_stack_ffffffffffffff37 = 1;
        QSqlTableModelPrivate::ModifiedRow::ModifiedRow
                  ((ModifiedRow *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff12,
                                                    in_stack_ffffffffffffff10))),
                   (Op)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   (QSqlRecord *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
        in_stack_ffffffffffffff36 = 1;
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                  ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
                   CONCAT44(row_00,in_stack_ffffffffffffff20),(int *)in_RDI,
                   (ModifiedRow *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff12,
                                                    in_stack_ffffffffffffff10))));
        in_stack_ffffffffffffff35 = 1;
        bVar2 = QSqlTableModelPrivate::ModifiedRow::submitted(&local_28);
        in_stack_ffffffffffffff12 = false;
        bVar1 = (bool)in_stack_ffffffffffffff12;
        if (bVar2) {
          in_stack_ffffffffffffff12 =
               isDirty((QSqlTableModel *)
                       CONCAT44(in_stack_ffffffffffffff14,
                                CONCAT13(uVar7,(uint3)in_stack_ffffffffffffff10)));
          bVar1 = (bool)in_stack_ffffffffffffff12;
        }
      }
      in_stack_ffffffffffffff07 = bVar1;
      in_stack_ffffffffffffff13 = in_stack_ffffffffffffff07;
      if ((in_stack_ffffffffffffff35 & 1) != 0) {
        QSqlTableModelPrivate::ModifiedRow::~ModifiedRow
                  ((ModifiedRow *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
      }
      if ((in_stack_ffffffffffffff36 & 1) != 0) {
        QSqlTableModelPrivate::ModifiedRow::~ModifiedRow
                  ((ModifiedRow *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
      }
      if ((in_stack_ffffffffffffff37 & 1) != 0) {
        QSqlRecord::~QSqlRecord((QSqlRecord *)0x16fe97);
      }
      if ((in_stack_ffffffffffffff07 & 1) != 0) {
        local_a1 = false;
        goto LAB_0016fff5;
      }
    }
    local_94 = local_6c + in_EDX;
    while (local_94 = local_94 + -1, local_6c <= local_94) {
      this_00 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                          ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,
                                             CONCAT15(in_stack_ffffffffffffff35,
                                                      in_stack_ffffffffffffff30))),
                           (int *)0xaaaaaaaaaaaaaaaa);
      OVar5 = QSqlTableModelPrivate::ModifiedRow::op(this_00);
      if (OVar5 == Insert) {
        (**(code **)(*in_RDI + 0x1c0))(in_RDI,local_94);
      }
      else {
        OVar5 = QSqlTableModelPrivate::ModifiedRow::op(this_00);
        if (OVar5 == None) {
          QSqlQueryModel::record((QSqlQueryModel *)this_00,row_00);
          QSqlTableModelPrivate::ModifiedRow::ModifiedRow
                    ((ModifiedRow *)
                     CONCAT44(in_stack_ffffffffffffff14,
                              CONCAT13(in_stack_ffffffffffffff13,
                                       CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)
                                      )),(Op)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (QSqlRecord *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
          QSqlTableModelPrivate::ModifiedRow::operator=
                    ((ModifiedRow *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                     in_stack_fffffffffffffef8);
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow
                    ((ModifiedRow *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
          QSqlRecord::~QSqlRecord((QSqlRecord *)0x16ff82);
        }
        else {
          QSqlTableModelPrivate::ModifiedRow::setOp
                    ((ModifiedRow *)
                     CONCAT44(in_stack_ffffffffffffff14,
                              CONCAT13(in_stack_ffffffffffffff13,
                                       CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)
                                      )),(Op)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        }
        if (pQVar6->strategy == OnManualSubmit) {
          QAbstractItemModel::headerDataChanged((Orientation)in_RDI,2,local_94);
        }
      }
    }
    if (pQVar6->strategy == OnManualSubmit) {
      local_a1 = true;
    }
    else {
      bVar3 = (**(code **)(*in_RDI + 0x170))();
      local_a1 = (bool)(bVar3 & 1);
    }
  }
  else {
    local_a1 = false;
  }
LAB_0016fff5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a1;
}

Assistant:

bool QSqlTableModel::removeRows(int row, int count, const QModelIndex &parent)
{
    Q_D(QSqlTableModel);
    if (parent.isValid() || row < 0 || count <= 0 || row + count > rowCount())
        return false;

    if (d->strategy != OnManualSubmit)
        if (count > 1 || (d->cache.value(row).submitted() && isDirty()))
            return false;

    // Iterate backwards so we don't have to worry about removed rows causing
    // higher cache entries to shift downwards.
    for (int idx = row + count - 1; idx >= row; --idx) {
        QSqlTableModelPrivate::ModifiedRow& mrow = d->cache[idx];
        if (mrow.op() == QSqlTableModelPrivate::Insert) {
            revertRow(idx);
        } else {
            if (mrow.op() == QSqlTableModelPrivate::None)
                mrow = QSqlTableModelPrivate::ModifiedRow(QSqlTableModelPrivate::Delete,
                                                          QSqlQueryModel::record(idx));
            else
                mrow.setOp(QSqlTableModelPrivate::Delete);
            if (d->strategy == OnManualSubmit)
                emit headerDataChanged(Qt::Vertical, idx, idx);
        }
    }

    if (d->strategy != OnManualSubmit)
        return submit();

    return true;
}